

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::EnumValueDescriptorProto::MergePartialFromCodedStream
          (EnumValueDescriptorProto *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  UnknownFieldSet *unknown_fields;
  string *psVar6;
  EnumValueOptions *value;
  char cVar7;
  uint tag;
  ulong uVar8;
  
LAB_005d86f8:
  pbVar2 = input->buffer_;
  uVar4 = 0;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar4 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_005d871c;
    input->buffer_ = pbVar2 + 1;
    uVar8 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_005d871c:
    uVar4 = io::CodedInputStream::ReadTagFallback(input,uVar4);
    uVar8 = 0;
    if (uVar4 - 1 < 0x7f) {
      uVar8 = 0x100000000;
    }
    uVar8 = uVar4 | uVar8;
  }
  tag = (uint)uVar8;
  if ((uVar8 & 0x100000000) != 0) {
    uVar5 = (uint)(uVar8 >> 3) & 0x1fffffff;
    cVar7 = (char)uVar8;
    if (uVar5 == 3) {
      if (cVar7 != '\x1a') goto LAB_005d873e;
      value = mutable_options(this);
      bVar3 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::EnumValueOptions>
                        (input,value);
      goto LAB_005d876e;
    }
    if (uVar5 == 2) {
      if (cVar7 == '\x10') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        bVar3 = internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,&this->number_);
        goto LAB_005d876e;
      }
      goto LAB_005d873e;
    }
    if ((uVar5 == 1) && (cVar7 == '\n')) {
      psVar6 = mutable_name_abi_cxx11_(this);
      bVar3 = internal::WireFormatLite::ReadBytes(input,psVar6);
      if (!bVar3) {
        return false;
      }
      psVar6 = (this->name_).ptr_;
      internal::WireFormatLite::VerifyUtf8String
                ((psVar6->_M_dataplus)._M_p,(int)psVar6->_M_string_length,PARSE,
                 "google.protobuf.EnumValueDescriptorProto.name");
      goto LAB_005d86f8;
    }
  }
LAB_005d873e:
  if (tag == 0) {
    return true;
  }
  if ((tag & 7) == 4) {
    return true;
  }
  unknown_fields = mutable_unknown_fields(this);
  bVar3 = internal::WireFormat::SkipField(input,tag,unknown_fields);
LAB_005d876e:
  if (bVar3 == false) {
    return false;
  }
  goto LAB_005d86f8;
}

Assistant:

bool EnumValueDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.EnumValueDescriptorProto)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.EnumValueDescriptorProto.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 number = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_number();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &number_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.EnumValueOptions options = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.EnumValueDescriptorProto)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.EnumValueDescriptorProto)
  return false;
#undef DO_
}